

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O3

int smem_write(int driverhandle,void *buffer,long nbytes)

{
  SHARED_LTAB *pSVar1;
  int iVar2;
  int iVar3;
  SHARED_P pvVar4;
  long lVar5;
  
  if (buffer == (void *)0x0) {
    return 0x98;
  }
  iVar2 = shared_check_locked_index(driverhandle);
  iVar3 = -1;
  if ((iVar2 == 0) && (shared_lt[driverhandle].lkcnt == -1)) {
    if (nbytes < 0) {
      iVar3 = 0x97;
    }
    else {
      lVar5 = shared_lt[driverhandle].seekpos;
      if ((long)shared_gt[driverhandle].size - 0x10U < (ulong)(lVar5 + nbytes)) {
        pvVar4 = shared_realloc(driverhandle,lVar5 + nbytes + 0x10);
        if (pvVar4 == (SHARED_P)0x0) {
          return 0x9c;
        }
        lVar5 = shared_lt[driverhandle].seekpos;
      }
      pSVar1 = shared_lt;
      memcpy((void *)((long)shared_lt[driverhandle].p + lVar5 + 0x18),buffer,nbytes);
      pSVar1[driverhandle].seekpos = pSVar1[driverhandle].seekpos + nbytes;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int     smem_write(int driverhandle, void *buffer, long nbytes)
 {
   if (NULL == buffer) return(SHARED_NULPTR);
   if (shared_check_locked_index(driverhandle)) return(SHARED_INVALID);
   if (-1 != shared_lt[driverhandle].lkcnt) return(SHARED_INVALID); /* are we locked RW ? */

   if (nbytes < 0) return(SHARED_BADARG);
   if ((unsigned long)(shared_lt[driverhandle].seekpos + nbytes) > (unsigned long)(shared_gt[driverhandle].size - sizeof(DAL_SHM_SEGHEAD)))
     {                  /* need to realloc shmem */
       if (NULL == shared_realloc(driverhandle, shared_lt[driverhandle].seekpos + nbytes + sizeof(DAL_SHM_SEGHEAD)))
         return(SHARED_NOMEM);
     }

   memcpy(((char *)(((DAL_SHM_SEGHEAD *)(shared_lt[driverhandle].p + 1)) + 1)) +
                shared_lt[driverhandle].seekpos,
          buffer,
          nbytes);

   shared_lt[driverhandle].seekpos += nbytes;
   return(0);
 }